

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

Option<unsigned_long> __thiscall Catch::list(Catch *this,shared_ptr<Catch::Config> *config)

{
  Config *pCVar1;
  long *plVar2;
  size_t sVar3;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char extraout_RDX_01 [8];
  char extraout_RDX_02 [8];
  char extraout_RDX_03 [8];
  char extraout_RDX_04 [8];
  char acVar4 [8];
  long lVar5;
  Option<unsigned_long> OVar6;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  *(undefined8 *)this = 0;
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_001b8ba0;
    IMutableContext::currentContext[1] = (long)&PTR__Context_001b8bf0;
  }
  plVar2 = IMutableContext::currentContext;
  local_28 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar2 + 0x38))(plVar2,&local_28);
  acVar4 = extraout_RDX;
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    acVar4 = extraout_RDX_00;
  }
  pCVar1 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((pCVar1->m_data).listTests == true) {
    if (*(long **)this == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = **(long **)this;
    }
    sVar3 = listTests(pCVar1);
    *(size_t *)(this + 8) = sVar3 + lVar5;
    *(Catch **)this = this + 8;
    acVar4 = extraout_RDX_01;
  }
  pCVar1 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((pCVar1->m_data).listTestNamesOnly == true) {
    if (*(long **)this == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = **(long **)this;
    }
    sVar3 = listTestsNamesOnly(pCVar1);
    *(size_t *)(this + 8) = sVar3 + lVar5;
    *(Catch **)this = this + 8;
    acVar4 = extraout_RDX_02;
  }
  pCVar1 = (config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((pCVar1->m_data).listTags == true) {
    if (*(long **)this == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = **(long **)this;
    }
    sVar3 = listTags(pCVar1);
    *(size_t *)(this + 8) = sVar3 + lVar5;
    *(Catch **)this = this + 8;
    acVar4 = extraout_RDX_03;
  }
  if ((((config->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_data).
      listReporters == true) {
    if (*(long **)this == (long *)0x0) {
      lVar5 = 0;
    }
    else {
      lVar5 = **(long **)this;
    }
    sVar3 = listReporters();
    *(size_t *)(this + 8) = sVar3 + lVar5;
    *(Catch **)this = this + 8;
    acVar4 = extraout_RDX_04;
  }
  OVar6.storage[0] = acVar4[0];
  OVar6.storage[1] = acVar4[1];
  OVar6.storage[2] = acVar4[2];
  OVar6.storage[3] = acVar4[3];
  OVar6.storage[4] = acVar4[4];
  OVar6.storage[5] = acVar4[5];
  OVar6.storage[6] = acVar4[6];
  OVar6.storage[7] = acVar4[7];
  OVar6.nullableValue = (unsigned_long *)this;
  return OVar6;
}

Assistant:

Option<std::size_t> list( std::shared_ptr<Config> const& config ) {
        Option<std::size_t> listedCount;
        getCurrentMutableContext().setConfig( config );
        if( config->listTests() )
            listedCount = listedCount.valueOr(0) + listTests( *config );
        if( config->listTestNamesOnly() )
            listedCount = listedCount.valueOr(0) + listTestsNamesOnly( *config );
        if( config->listTags() )
            listedCount = listedCount.valueOr(0) + listTags( *config );
        if( config->listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters();
        return listedCount;
    }